

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  RepeatedField<int> *value;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  void **ppvVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  ulong uVar7;
  long lVar8;
  
  sVar2 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  value = &(this->field_0)._impl_.targets_;
  sVar3 = internal::WireFormatLite::EnumSize(value);
  uVar1 = RepeatedField<int>::size(value);
  lVar8 = sVar3 + sVar2 + ((long)*(int *)((long)&this->field_0 + 0x38) + (ulong)uVar1) * 2;
  this_00 = &(this->field_0)._impl_.edition_defaults_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar5 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(this_00);
  for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
    sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions_EditionDefault>
                      ((FieldOptions_EditionDefault *)*ppvVar4);
    lVar8 = lVar8 + sVar2;
  }
  lVar8 = lVar8 + (long)*(int *)((long)&this->field_0 + 0x50) * 2;
  this_01 = &(this->field_0)._impl_.uninterpreted_option_;
  ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  cVar6 = RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_01);
  for (; ppvVar4 != cVar6.it_; ppvVar4 = ppvVar4 + 1) {
    sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)*ppvVar4);
    lVar8 = lVar8 + sVar2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  sVar2 = (ulong)(uVar1 >> 9 & 1) * 3 + lVar8 +
          (ulong)(((uVar1 >> 3 & 0x2f) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 2;
  if ((uVar1 & 0x87) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sVar2 = sVar2 + sVar3 + 2;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions_FeatureSupport>
                        ((this->field_0)._impl_.feature_support_);
      sVar2 = sVar2 + sVar3 + 2;
    }
    if ((uVar1 & 4) != 0) {
      uVar7 = (long)(this->field_0)._impl_.ctype_ | 1;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      sVar2 = sVar2 + ((int)lVar8 * 9 + 0x49U >> 6) + 1;
    }
    if ((char)uVar1 < '\0') {
      uVar7 = (long)(this->field_0)._impl_.jstype_ | 1;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      sVar2 = sVar2 + ((int)lVar8 * 9 + 0x49U >> 6) + 1;
    }
  }
  if ((uVar1 >> 10 & 1) != 0) {
    uVar7 = (long)(this->field_0)._impl_.retention_ | 1;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar8 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t FieldOptions::ByteSizeLong() const {
  const FieldOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FieldOptions.OptionTargetType targets = 19;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_targets());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_targets_size());
      total_size += data_size + tag_size;
    }
    // repeated .google.protobuf.FieldOptions.EditionDefault edition_defaults = 20;
    {
      total_size += 2UL * this_._internal_edition_defaults_size();
      for (const auto& msg : this_._internal_edition_defaults()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000200u & cached_has_bits) * 3;
  total_size += ::absl::popcount(0x00000178u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x00000087u) != 0) {
    // optional .google.protobuf.FeatureSet features = 21;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 22;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.feature_support_);
    }
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_ctype());
    }
    // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_jstype());
    }
  }
   {
    // optional .google.protobuf.FieldOptions.OptionRetention retention = 17;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_retention());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}